

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_unit.cpp
# Opt level: O3

void anon_unknown.dwarf_7e6f::test_art_simple(void **param_1)

{
  art_val_t *paVar1;
  allocator_type *__a;
  ulong uVar2;
  pointer val;
  initializer_list<const_char_*> __l;
  initializer_list<(anonymous_namespace)::Value> __l_00;
  vector<const_char_*,_std::allocator<const_char_*>_> keys;
  vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_> values;
  art_t art;
  vector<const_char_*,_std::allocator<const_char_*>_> local_a8;
  vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_> local_90;
  Value local_78;
  char *local_68;
  char *pcStack_60;
  char *local_58;
  undefined8 local_50;
  undefined8 local_40;
  undefined8 local_30;
  
  local_58 = "001005";
  local_68 = "000003";
  pcStack_60 = "000004";
  local_78._0_8_ = "000001";
  local_78.val = 0x10c115;
  __a = (allocator_type *)&local_90;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_78;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&local_a8,__l,__a);
  local_78.val = 1;
  pcStack_60 = (char *)0x2;
  local_50 = 3;
  local_40 = 4;
  local_30 = 5;
  __l_00._M_len = 5;
  __l_00._M_array = &local_78;
  std::vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::vector
            (&local_90,__l_00,(allocator_type *)__a);
  local_78.super_art_val_t.key[0] = '\0';
  local_78.super_art_val_t.key[1] = '\0';
  local_78.super_art_val_t.key[2] = '\0';
  local_78.super_art_val_t.key[3] = '\0';
  local_78.super_art_val_t.key[4] = '\0';
  local_78.super_art_val_t.key[5] = '\0';
  local_78._6_2_ = 0;
  if (local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar2 = 0;
    val = local_90.
          super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      art_insert((art_t *)&local_78,
                 (art_key_chunk_t *)
                 local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar2],(art_val_t *)val);
      uVar2 = uVar2 + 1;
      val = val + 1;
    } while (uVar2 < (ulong)((long)local_a8.
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_a8.
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  paVar1 = art_find((art_t *)&local_78,
                    (art_key_chunk_t *)
                    *local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  _assert_true((ulong)(*(uint64_t *)(paVar1[1].key + 2) ==
                      (local_90.
                       super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
                       ._M_impl.super__Vector_impl_data._M_start)->val),"*found_val == values[0]",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0xad);
  paVar1 = art_erase((art_t *)&local_78,
                     (art_key_chunk_t *)
                     *local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  _assert_true((ulong)(*(uint64_t *)(paVar1[1].key + 2) ==
                      (local_90.
                       super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
                       ._M_impl.super__Vector_impl_data._M_start)->val),"*erased_val == values[0]",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0xaf);
  art_free((art_t *)&local_78);
  operator_delete(local_90.
                  super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
                  ._M_impl.super__Vector_impl_data._M_start);
  if (local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

DEFINE_TEST(test_art_simple) {
    std::vector<const char*> keys = {
        "000001", "000002", "000003", "000004", "001005",
    };
    std::vector<Value> values = {{1}, {2}, {3}, {4}, {5}};

    art_t art{NULL};
    for (size_t i = 0; i < keys.size(); ++i) {
        art_insert(&art, (art_key_chunk_t*)keys[i], &values[i]);
    }
    Value* found_val = (Value*)art_find(&art, (uint8_t*)keys[0]);
    assert_true(*found_val == values[0]);
    Value* erased_val = (Value*)art_erase(&art, (uint8_t*)keys[0]);
    assert_true(*erased_val == values[0]);
    art_free(&art);
}